

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * __thiscall llvm::raw_fd_ostream::reverseColor(raw_fd_ostream *this)

{
  bool bVar1;
  char *__s;
  void *__buf;
  size_t in_RCX;
  
  bVar1 = sys::Process::ColorNeedsFlush();
  if ((bVar1) && (*(long *)&this->field_0x18 != *(long *)&this->field_0x8)) {
    raw_ostream::flush_nonempty((raw_ostream *)this);
  }
  __s = sys::Process::OutputReverse();
  if (__s != (char *)0x0) {
    __buf = (void *)strlen(__s);
    raw_ostream::write((raw_ostream *)this,(int)__s,__buf,in_RCX);
    this->pos = this->pos - (long)__buf;
  }
  return (raw_ostream *)this;
}

Assistant:

raw_ostream &raw_fd_ostream::reverseColor() {
  if (sys::Process::ColorNeedsFlush())
    flush();
  const char *colorcode = sys::Process::OutputReverse();
  if (colorcode) {
    size_t len = strlen(colorcode);
    write(colorcode, len);
    // don't account colors towards output characters
    pos -= len;
  }
  return *this;
}